

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

box get_yolo_box(yolo_layer *layer,int n,int index,int i,int j,int lw,int lh,int w,int h,int stride)

{
  float fVar1;
  float fVar2;
  float fVar3;
  box bVar4;
  float *pfVar5;
  const_reference pvVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar7;
  double dVar8;
  int in_stack_00000008;
  float *predictions;
  int in_stack_00000018;
  box b;
  
  pfVar5 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x10abfd);
  fVar1 = pfVar5[in_EDX];
  fVar2 = pfVar5[in_EDX + j];
  dVar7 = exp((double)pfVar5[in_EDX + j * 2]);
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x20),(long)(in_ESI * 2));
  fVar3 = *pvVar6;
  dVar8 = exp((double)pfVar5[in_EDX + j * 3]);
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x20),
                      (long)(in_ESI * 2 + 1));
  bVar4.y = ((float)in_R8D + fVar2) / (float)in_stack_00000008;
  bVar4.x = ((float)in_ECX + fVar1) / (float)in_R9D;
  bVar4.w = (float)((dVar7 * (double)fVar3) / (double)(int)predictions);
  bVar4.h = (float)((dVar8 * (double)*pvVar6) / (double)in_stack_00000018);
  return bVar4;
}

Assistant:

static box get_yolo_box(const yolo_layer & layer, int n, int index, int i, int j, int lw, int lh, int w, int h, int stride)
{
    const float * predictions = layer.predictions.data();
    box b;
    b.x = (i + predictions[index + 0*stride]) / lw;
    b.y = (j + predictions[index + 1*stride]) / lh;
    b.w = exp(predictions[index + 2*stride]) * layer.anchors[2*n]   / w;
    b.h = exp(predictions[index + 3*stride]) * layer.anchors[2*n+1] / h;
    return b;
}